

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  processingInstructionSAXFunc p_Var4;
  int iVar5;
  uint val;
  xmlCatalogAllow xVar6;
  xmlChar *pxVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  int l;
  xmlChar *local_68;
  int local_5c;
  xmlChar *local_58;
  ulong local_50;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  uVar11 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar11 = 10000000;
  }
  pxVar2 = ctxt->input;
  pxVar7 = pxVar2->cur;
  if (*pxVar7 != '<') {
    return;
  }
  if (pxVar7[1] != '?') {
    return;
  }
  iVar5 = pxVar2->id;
  xVar1 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  pxVar2->cur = pxVar7 + 2;
  pxVar2->col = pxVar2->col + 2;
  if (pxVar7[2] == '\0') {
    xmlParserInputGrow(pxVar2,0xfa);
  }
  if (ctxt->progressive == 0) {
    pxVar2 = ctxt->input;
    if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
       ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  pxVar7 = xmlParsePITarget(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
  }
  else {
    pxVar3 = ctxt->input->cur;
    if ((*pxVar3 != '?') || (pxVar3[1] != '>')) {
      local_68 = (xmlChar *)(*xmlMallocAtomic)(100);
      if (local_68 == (xmlChar *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
      }
      else {
        local_44 = iVar5;
        iVar5 = xmlSkipBlankChars(ctxt);
        if (iVar5 == 0) {
          xmlFatalErrMsgStr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar7);
        }
        local_58 = pxVar7;
        val = xmlCurrentChar(ctxt,&local_5c);
        uVar8 = 0;
        uVar12 = 0;
        uVar9 = 100;
        local_40 = uVar11;
        do {
          pxVar7 = local_58;
          if (0xff < (int)val) {
            if ((val - 0x10000 < 0x100000 || val - 0xe000 < 0x1ffe) || (int)val < 0xd800)
            goto LAB_0015c3bb;
LAB_0015c5f8:
            local_68[uVar12] = '\0';
            if (val == 0x3f) {
              if (local_44 != ctxt->input->id) {
                xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                               "PI declaration doesn\'t start and stop in the same entity\n");
              }
              pxVar2 = ctxt->input;
              pxVar3 = pxVar2->cur;
              pxVar2->cur = pxVar3 + 2;
              pxVar2->col = pxVar2->col + 2;
              if (pxVar3[2] == '\0') {
                xmlParserInputGrow(pxVar2,0xfa);
              }
              if ((((uint)xVar1 < 2) &&
                  (iVar5 = xmlStrEqual(pxVar7,(xmlChar *)"oasis-xml-catalog"), iVar5 != 0)) &&
                 (xVar6 = xmlCatalogGetDefaults(),
                 (xVar6 & ~XML_CATA_ALLOW_GLOBAL) == XML_CATA_ALLOW_DOCUMENT)) {
                xmlParseCatalogPI(ctxt,local_68);
              }
              if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
                 (p_Var4 = ctxt->sax->processingInstruction,
                 p_Var4 != (processingInstructionSAXFunc)0x0)) {
                (*p_Var4)(ctxt->userData,pxVar7,local_68);
              }
            }
            else {
              xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",
                                local_58);
            }
            (*xmlFree)(local_68);
            goto LAB_0015c6ee;
          }
          if ((int)val < 0x20) {
            if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) goto LAB_0015c5f8;
          }
          else {
LAB_0015c3bb:
            if ((val == 0x3f) && (ctxt->input->cur[1] == '>')) goto LAB_0015c5f8;
          }
          sVar10 = uVar9;
          pxVar7 = local_68;
          if (uVar9 <= uVar12 + 5) {
            sVar10 = uVar9 * 2;
            local_50 = uVar9;
            local_38 = uVar8;
            pxVar7 = (xmlChar *)(*xmlRealloc)(local_68,sVar10);
            uVar8 = local_38;
            uVar11 = local_40;
            if (pxVar7 == (xmlChar *)0x0) {
              xmlErrMemory(ctxt,(char *)0x0);
              (*xmlFree)(local_68);
              ctxt->instate = xVar1;
              return;
            }
          }
          local_68 = pxVar7;
          local_50 = sVar10;
          if ((int)uVar8 < 0x32) {
            uVar8 = (ulong)((int)uVar8 + 1);
          }
          else {
            if (ctxt->progressive == 0) {
              pxVar2 = ctxt->input;
              if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
                 ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
                xmlSHRINK(ctxt);
              }
            }
            if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)
               ) {
              xmlGROW(ctxt);
            }
            uVar8 = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
              (*xmlFree)(local_68);
              return;
            }
          }
          if (local_5c == 1) {
            local_68[uVar12] = (xmlChar)val;
            uVar12 = uVar12 + 1;
          }
          else {
            iVar5 = xmlCopyCharMultiByte(local_68 + uVar12,val);
            uVar12 = uVar12 + (long)iVar5;
          }
          pxVar2 = ctxt->input;
          if (*pxVar2->cur == '\n') {
            pxVar2->line = pxVar2->line + 1;
            pxVar2->col = 1;
          }
          else {
            pxVar2->col = pxVar2->col + 1;
          }
          pxVar2->cur = pxVar2->cur + local_5c;
          val = xmlCurrentChar(ctxt,&local_5c);
          if (val == 0) {
            if (ctxt->progressive == 0) {
              pxVar2 = ctxt->input;
              if ((500 < (long)pxVar2->cur - (long)pxVar2->base) &&
                 ((long)pxVar2->end - (long)pxVar2->cur < 500)) {
                xmlSHRINK(ctxt);
              }
            }
            if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)
               ) {
              xmlGROW(ctxt);
            }
            val = xmlCurrentChar(ctxt,&local_5c);
          }
          uVar9 = local_50;
        } while (uVar12 <= uVar11);
        xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",local_58);
        (*xmlFree)(local_68);
      }
      goto LAB_0015c6f7;
    }
    if (iVar5 != ctxt->input->id) {
      xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                     "PI declaration doesn\'t start and stop in the same entity\n");
    }
    pxVar2 = ctxt->input;
    pxVar3 = pxVar2->cur;
    pxVar2->cur = pxVar3 + 2;
    pxVar2->col = pxVar2->col + 2;
    if (pxVar3[2] == '\0') {
      xmlParserInputGrow(pxVar2,0xfa);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var4 = ctxt->sax->processingInstruction, p_Var4 != (processingInstructionSAXFunc)0x0)) {
      (*p_Var4)(ctxt->userData,pxVar7,(xmlChar *)0x0);
    }
  }
LAB_0015c6ee:
  if (ctxt->instate == XML_PARSER_EOF) {
    return;
  }
LAB_0015c6f7:
  ctxt->instate = xVar1;
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if ((RAW == '<') && (NXT(1) == '?')) {
	int inputid = ctxt->input->id;
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		if (ctxt->instate != XML_PARSER_EOF)
		    ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size);
	    if (buf == NULL) {
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = CUR_CHAR(l);
	    while (IS_CHAR(cur) && /* checked */
		   ((cur != '?') || (NXT(1) != '>'))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    size_t new_size = size * 2;
		    tmp = (xmlChar *) xmlRealloc(buf, new_size);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
                    size = new_size;
		}
		count++;
		if (count > 50) {
		    SHRINK;
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buf);
                        return;
                    }
		    count = 0;
		}
		COPY_BUF(l,buf,len,cur);
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
                if (len > maxLength) {
                    xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                      "PI %s too big found", target);
                    xmlFree(buf);
                    ctxt->instate = state;
                    return;
                }
	    }
	    buf[len] = 0;
	    if (cur != '?') {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if (((state == XML_PARSER_MISC) ||
	             (state == XML_PARSER_START)) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();
		    if ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			(allow == XML_CATA_ALLOW_ALL))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif


		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF)
	    ctxt->instate = state;
    }
}